

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestSuite * __thiscall testing::UnitTest::GetMutableTestSuite(UnitTest *this,int i)

{
  UnitTestImpl *pUVar1;
  pointer piVar2;
  TestSuite *pTVar3;
  uint uVar4;
  
  pUVar1 = this->impl_;
  uVar4 = 0xffffffff;
  if ((-1 < i) &&
     (piVar2 = (pUVar1->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(pUVar1->test_suite_indices_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar2) >> 2))) {
    uVar4 = piVar2[(uint)i];
  }
  if ((int)uVar4 < 0) {
    pTVar3 = (TestSuite *)0x0;
  }
  else {
    pTVar3 = (pUVar1->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_start[uVar4];
  }
  return pTVar3;
}

Assistant:

TestSuite* UnitTest::GetMutableTestSuite(int i) {
  return impl()->GetMutableSuiteCase(i);
}